

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::UnitTestOptions::MatchesFilter(string *name_str,char *filter)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *name_begin;
  char *name_end;
  char *pcVar9;
  char *pcVar10;
  
  pcVar2 = (name_str->_M_dataplus)._M_p;
  pcVar9 = pcVar2 + name_str->_M_string_length;
LAB_00131b81:
  pcVar4 = strchr(filter,0x3a);
  pcVar7 = pcVar2;
  pcVar8 = pcVar2;
  pcVar10 = filter;
  pcVar6 = pcVar4;
  if (pcVar4 == (char *)0x0) {
    sVar5 = strlen(filter);
    pcVar6 = filter + sVar5;
  }
LAB_00131ba7:
  do {
    while( true ) {
      bVar3 = pcVar6 <= pcVar10 && pcVar9 <= pcVar8;
      if (bVar3) {
        return bVar3;
      }
      if (pcVar6 <= pcVar10) goto LAB_00131bfd;
      cVar1 = *pcVar10;
      if (cVar1 != '*') break;
      filter = pcVar10;
      pcVar7 = pcVar8 + 1;
      pcVar10 = pcVar10 + 1;
    }
    if (cVar1 == '?') {
      if (pcVar8 < pcVar9) {
LAB_00131bf2:
        pcVar8 = pcVar8 + 1;
        pcVar10 = pcVar10 + 1;
        goto LAB_00131ba7;
      }
    }
    else if ((pcVar8 < pcVar9) && (*pcVar8 == cVar1)) goto LAB_00131bf2;
LAB_00131bfd:
    if ((pcVar7 <= pcVar2) || (pcVar8 = pcVar7, pcVar10 = filter, pcVar9 < pcVar7)) break;
  } while( true );
  filter = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    return bVar3;
  }
  goto LAB_00131b81;
}

Assistant:

bool UnitTestOptions::MatchesFilter(const std::string& name_str,
                                    const char* filter) {
  // The filter is a list of patterns separated by colons (:).
  const char* pattern = filter;
  while (true) {
    // Find the bounds of this pattern.
    const char* const next_sep = strchr(pattern, ':');
    const char* const pattern_end =
        next_sep != nullptr ? next_sep : pattern + strlen(pattern);

    // Check if this pattern matches name_str.
    if (PatternMatchesString(name_str, pattern, pattern_end)) {
      return true;
    }

    // Give up on this pattern. However, if we found a pattern separator (:),
    // advance to the next pattern (skipping over the separator) and restart.
    if (next_sep == nullptr) {
      return false;
    }
    pattern = next_sep + 1;
  }
  return true;
}